

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

RepeatedField<int> *
google::protobuf::Arena::InternalHelper<google::protobuf::RepeatedField<int>>::
Construct<google::protobuf::Arena*>(void *ptr,Arena **args)

{
  internal::ShortSooRep::ShortSooRep((ShortSooRep *)ptr,*args);
  if ((*ptr & 4) != 0) {
    internal::LongSooRep::elements((LongSooRep *)ptr);
  }
  return (RepeatedField<int> *)ptr;
}

Assistant:

static T* Construct(void* ptr, Args&&... args) {
      return new (ptr) T(static_cast<Args&&>(args)...);
    }